

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O1

Maybe<capnp::compiler::Compiler::CompiledType> * __thiscall
capnp::compiler::Compiler::ModuleScope::evalType
          (Maybe<capnp::compiler::Compiler::CompiledType> *__return_storage_ptr__,ModuleScope *this,
          Reader expression,ErrorReporter *errorReporter)

{
  MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *pMVar1;
  uint *puVar2;
  Compiler *pCVar3;
  Node *startingScope;
  uint64_t startingScopeId;
  ImplicitParams implicitMethodParams;
  undefined1 auVar4 [40];
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> *pEVar5;
  BrandScope *pBVar6;
  undefined8 uVar7;
  Mutex *pMVar8;
  BrandScope *pBVar9;
  BrandScope *ptrCopy;
  NullableValue<capnp::compiler::BrandedDecl> _result1457;
  Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> lock;
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> newDecl;
  undefined1 local_338 [16];
  anon_union_96_1_a8a2e026_for_OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_2
  aStack_328;
  BrandScope *pBStack_2c8;
  BrandScope *local_2c0;
  SegmentReader *pSStack_2b8;
  CapTableReader *local_2b0;
  WirePointer *pWStack_2a8;
  WirePointer *local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  Mutex *local_288;
  Own<capnp::compiler::Compiler::Impl,_std::nullptr_t> *local_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined6 uStack_260;
  undefined2 local_25a;
  undefined6 uStack_258;
  undefined2 uStack_252;
  undefined6 uStack_250;
  undefined1 local_24a;
  undefined1 uStack_249;
  undefined4 local_248;
  undefined4 uStack_244;
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> local_240;
  Maybe<capnp::compiler::BrandedDecl> local_190;
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> local_e0;
  
  local_e0.mutex = (Mutex *)0x0;
  local_e0.value.body.tag = 0;
  local_e0.value.brand.disposer = (Disposer *)0x0;
  local_e0.value.brand.ptr = (BrandScope *)0x0;
  local_e0.value.source._reader.segment = (SegmentReader *)0x0;
  local_e0.value.source._reader.capTable = (CapTableReader *)0x0;
  local_e0.value.source._reader.data = (WirePointer *)0x0;
  local_e0.value.source._reader.pointers._0_6_ = 0;
  local_e0.value.source._reader.pointers._6_2_ = 0;
  local_e0.value.source._reader.dataSize = 0;
  local_e0.value.source._reader.pointerCount = 0;
  local_e0.value.source._reader.nestingLimit = 0x7fffffff;
  pCVar3 = this->compiler;
  pMVar1 = &pCVar3->impl;
  kj::_::Mutex::lock(&pMVar1->mutex,0);
  local_280 = &(pCVar3->impl).value;
  startingScope = this->node;
  startingScopeId = startingScope->id;
  local_288 = &pMVar1->mutex;
  pBVar9 = (BrandScope *)operator_new(0x50);
  BrandScope::BrandScope(pBVar9,errorReporter,startingScopeId,0,&startingScope->super_Resolver);
  puVar2 = &(pBVar9->super_Refcounted).refcount;
  *puVar2 = *puVar2 + 1;
  uStack_258 = 0;
  uStack_252 = 0;
  uStack_250 = 0;
  uStack_268 = 0;
  uStack_260 = 0;
  local_25a = 0;
  local_278 = 0;
  uStack_270 = 0;
  local_24a = 7;
  local_248 = 0x7fffffff;
  implicitMethodParams.params.reader._44_4_ = uStack_244;
  implicitMethodParams.params.reader.nestingLimit = 0x7fffffff;
  implicitMethodParams.params.reader._39_1_ = uStack_249;
  implicitMethodParams.params.reader.structDataSize = 0;
  implicitMethodParams.params.reader.structPointerCount = 0;
  implicitMethodParams.params.reader.elementSize = INLINE_COMPOSITE;
  auVar4 = ZEXT1640(ZEXT816(0));
  implicitMethodParams.scopeId = auVar4._0_8_;
  implicitMethodParams.params.reader.segment = (SegmentReader *)auVar4._8_8_;
  implicitMethodParams.params.reader.capTable = (CapTableReader *)auVar4._16_8_;
  implicitMethodParams.params.reader.ptr = (byte *)auVar4._24_8_;
  implicitMethodParams.params.reader.elementCount = auVar4._32_4_;
  implicitMethodParams.params.reader.step = auVar4._36_4_;
  BrandScope::compileDeclExpression
            (&local_190,pBVar9,expression,&this->node->super_Resolver,implicitMethodParams);
  uVar7 = local_190.ptr.field_1.value.brand.ptr;
  if (local_190.ptr.isSet == true) {
    local_338._0_4_ = local_190.ptr.field_1.value.body.tag;
    if (local_190.ptr.field_1.value.body.tag == 2) {
      local_338._8_8_ = local_190.ptr.field_1._8_8_;
      aStack_328._0_8_ = local_190.ptr.field_1._16_8_;
    }
    else if (local_190.ptr.field_1.value.body.tag == 1) {
      aStack_328._24_8_ = local_190.ptr.field_1._40_8_;
      aStack_328._8_8_ = local_190.ptr.field_1._24_8_;
      aStack_328._16_8_ = local_190.ptr.field_1._32_8_;
      local_338._8_8_ = local_190.ptr.field_1._8_8_;
      aStack_328._0_8_ = local_190.ptr.field_1._16_8_;
      aStack_328.space[0x20] = local_190.ptr.field_1._48_1_;
      if (local_190.ptr.field_1._48_1_ == '\x01') {
        aStack_328._72_8_ = local_190.ptr.field_1._88_8_;
        aStack_328._80_8_ = local_190.ptr.field_1._96_8_;
        aStack_328._56_8_ = local_190.ptr.field_1._72_8_;
        aStack_328._64_8_ = local_190.ptr.field_1._80_8_;
        aStack_328._40_8_ = local_190.ptr.field_1._56_8_;
        aStack_328._48_8_ = local_190.ptr.field_1._64_8_;
        local_190.ptr.field_1._48_1_ = '\0';
      }
    }
    aStack_328._92_4_ = local_190.ptr.field_1._108_4_;
    aStack_328._88_4_ = local_190.ptr.field_1._104_4_;
    local_2c0 = (BrandScope *)CONCAT44(local_190.ptr.field_1._124_4_,local_190.ptr.field_1._120_4_);
    pSStack_2b8 = (SegmentReader *)
                  CONCAT44(local_190.ptr.field_1._132_4_,local_190.ptr.field_1._128_4_);
    local_2b0 = (CapTableReader *)
                CONCAT44(local_190.ptr.field_1._140_4_,local_190.ptr.field_1._136_4_);
    pWStack_2a8 = (WirePointer *)
                  CONCAT44(local_190.ptr.field_1._148_4_,local_190.ptr.field_1._144_4_);
    local_2a0 = (WirePointer *)
                CONCAT44(local_190.ptr.field_1._156_4_,
                         local_190.ptr.field_1.value.source._reader.dataSize);
    uStack_298._4_4_ = local_190.ptr.field_1._164_4_;
    uStack_298._0_4_ = local_190.ptr.field_1.value.source._reader.nestingLimit;
    local_190.ptr.field_1.value.brand.ptr = (BrandScope *)0x0;
    pBStack_2c8 = (BrandScope *)uVar7;
    if (local_190.ptr.field_1.value.body.tag == 1) {
      local_190.ptr.field_1.value.body.tag = 0;
    }
    if (local_190.ptr.field_1.value.body.tag == 2) {
      local_190.ptr.field_1.value.body.tag = 0;
    }
  }
  if (local_190.ptr.isSet == true) {
    local_e0.mutex = local_288;
    BrandedDecl::operator=(&local_e0.value,(BrandedDecl *)local_338);
    pBVar6 = pBStack_2c8;
    if (pBStack_2c8 != (BrandScope *)0x0) {
      pBStack_2c8 = (BrandScope *)0x0;
      (***(_func_int ***)aStack_328._88_8_)
                (aStack_328._88_8_,
                 (_func_int *)
                 ((long)&(pBVar6->super_Refcounted).super_Disposer._vptr_Disposer +
                 (long)(pBVar6->super_Refcounted).super_Disposer._vptr_Disposer[-2]));
    }
    if (local_338._0_4_ == 1) {
      local_338._0_8_ = local_338._0_8_ & 0xffffffff00000000;
    }
    if (local_338._0_4_ == 2) {
      local_338._0_8_ = local_338._0_8_ & 0xffffffff00000000;
    }
  }
  (**(pBVar9->super_Refcounted).super_Disposer._vptr_Disposer)(pBVar9);
  if (local_288 != (Mutex *)0x0) {
    kj::_::Mutex::unlock(local_288,EXCLUSIVE,(Waiter *)0x0);
  }
  pBVar9 = local_e0.value.brand.ptr;
  pMVar8 = local_e0.mutex;
  if (local_190.ptr.isSet == false) {
    (__return_storage_ptr__->ptr).isSet = false;
  }
  else {
    pCVar3 = this->compiler;
    local_240.value.body.tag = local_e0.value.body.tag;
    if (local_e0.value.body.tag == 1) {
      local_240.value.body.field_1._32_8_ = local_e0.value.body.field_1._32_8_;
      local_240.value.body.field_1._16_8_ = local_e0.value.body.field_1._16_8_;
      local_240.value.body.field_1._24_8_ = local_e0.value.body.field_1._24_8_;
      local_240.value.body.field_1._0_8_ = local_e0.value.body.field_1._0_8_;
      local_240.value.body.field_1._8_8_ = local_e0.value.body.field_1._8_8_;
      local_240.value.body.field_1.space[0x28] = local_e0.value.body.field_1.space[0x28];
      if (local_e0.value.body.field_1.space[0x28] == '\x01') {
        local_240.value.body.field_1._80_8_ = local_e0.value.body.field_1._80_8_;
        local_240.value.body.field_1._88_8_ = local_e0.value.body.field_1._88_8_;
        local_240.value.body.field_1._64_8_ = local_e0.value.body.field_1._64_8_;
        local_240.value.body.field_1._72_8_ = local_e0.value.body.field_1._72_8_;
        local_240.value.body.field_1._48_8_ = local_e0.value.body.field_1._48_8_;
        local_240.value.body.field_1._56_8_ = local_e0.value.body.field_1._56_8_;
        local_e0.value.body.field_1.space[0x28] = '\0';
      }
    }
    if (local_e0.value.body.tag == 2) {
      local_240.value.body.field_1._0_8_ = local_e0.value.body.field_1._0_8_;
      local_240.value.body.field_1._8_8_ = local_e0.value.body.field_1._8_8_;
    }
    local_240.value.source._reader.pointers =
         (WirePointer *)
         CONCAT26(local_e0.value.source._reader.pointers._6_2_,
                  local_e0.value.source._reader.pointers._0_6_);
    local_240.value.source._reader._38_2_ = local_e0.value.source._reader._38_2_;
    local_240.value.source._reader.dataSize = local_e0.value.source._reader.dataSize;
    local_240.value.source._reader.pointerCount = local_e0.value.source._reader.pointerCount;
    local_240.value.source._reader._44_4_ = local_e0.value.source._reader._44_4_;
    local_240.value.source._reader.nestingLimit = local_e0.value.source._reader.nestingLimit;
    local_240.value.brand.disposer = local_e0.value.brand.disposer;
    local_e0.value.brand.ptr = (BrandScope *)0x0;
    local_240.value.source._reader.segment = local_e0.value.source._reader.segment;
    local_240.value.source._reader.capTable = local_e0.value.source._reader.capTable;
    local_240.value.source._reader.data = local_e0.value.source._reader.data;
    local_e0.mutex = (Mutex *)0x0;
    local_338._8_4_ = local_e0.value.body.tag;
    if (local_e0.value.body.tag == 1) {
      aStack_328._32_8_ = local_240.value.body.field_1._32_8_;
      aStack_328._16_8_ = local_240.value.body.field_1._16_8_;
      aStack_328._24_8_ = local_240.value.body.field_1._24_8_;
      aStack_328._0_8_ = local_240.value.body.field_1._0_8_;
      aStack_328._8_8_ = local_240.value.body.field_1._8_8_;
      aStack_328.space[0x28] = local_240.value.body.field_1.space[0x28];
      if (local_240.value.body.field_1.space[0x28] == '\x01') {
        aStack_328._80_8_ = local_240.value.body.field_1._80_8_;
        aStack_328._88_8_ = local_240.value.body.field_1._88_8_;
        aStack_328._64_8_ = local_240.value.body.field_1._64_8_;
        aStack_328._72_8_ = local_240.value.body.field_1._72_8_;
        aStack_328._48_8_ = local_240.value.body.field_1._48_8_;
        aStack_328._56_8_ = local_240.value.body.field_1._56_8_;
        local_240.value.body.field_1.space[0x28] = '\0';
      }
    }
    if (local_e0.value.body.tag == 2) {
      aStack_328._0_8_ = local_240.value.body.field_1._0_8_;
      aStack_328._8_8_ = local_240.value.body.field_1._8_8_;
    }
    pBStack_2c8 = (BrandScope *)local_e0.value.brand.disposer;
    local_240.value.brand.ptr = (BrandScope *)0x0;
    local_2a0 = (WirePointer *)
                CONCAT26(local_e0.value.source._reader.pointers._6_2_,
                         local_e0.value.source._reader.pointers._0_6_);
    uStack_298._6_2_ = local_e0.value.source._reader._38_2_;
    uStack_298._0_4_ = local_e0.value.source._reader.dataSize;
    uStack_298._4_2_ = local_e0.value.source._reader.pointerCount;
    uStack_290._4_4_ = local_e0.value.source._reader._44_4_;
    uStack_290._0_4_ = local_e0.value.source._reader.nestingLimit;
    pSStack_2b8 = local_e0.value.source._reader.segment;
    local_2b0 = local_e0.value.source._reader.capTable;
    pWStack_2a8 = (WirePointer *)local_e0.value.source._reader.data;
    local_240.mutex = (Mutex *)0x0;
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.compiler = pCVar3;
    (__return_storage_ptr__->ptr).field_1.value.decl.mutex = pMVar8;
    *(uint *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) = local_e0.value.body.tag;
    if (local_e0.value.body.tag == 1) {
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 0x20) =
           aStack_328._32_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 0x10) =
           aStack_328._16_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 0x18) =
           aStack_328._24_8_;
      *(undefined8 *)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 =
           aStack_328._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 8) =
           aStack_328._8_8_;
      *(byte *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) = aStack_328.space[0x28];
      if (aStack_328.space[0x28] == '\x01') {
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 0x50) =
             aStack_328._80_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 0x58) =
             aStack_328._88_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 0x40) =
             aStack_328._64_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 0x48) =
             aStack_328._72_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 0x30) =
             aStack_328._48_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 0x38) =
             aStack_328._56_8_;
        aStack_328._40_8_ = aStack_328._40_8_ & 0xffffffffffffff00;
      }
    }
    if (local_e0.value.body.tag == 2) {
      *(undefined8 *)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 =
           aStack_328._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 8) =
           aStack_328._8_8_;
    }
    (__return_storage_ptr__->ptr).field_1.value.decl.value.brand.disposer =
         local_e0.value.brand.disposer;
    (__return_storage_ptr__->ptr).field_1.value.decl.value.brand.ptr = pBVar9;
    local_2c0 = (BrandScope *)0x0;
    pEVar5 = &(__return_storage_ptr__->ptr).field_1.value.decl;
    (pEVar5->value).source._reader.dataSize = local_e0.value.source._reader.dataSize;
    (pEVar5->value).source._reader.pointerCount = local_e0.value.source._reader.pointerCount;
    *(undefined2 *)&(pEVar5->value).source._reader.field_0x26 = local_e0.value.source._reader._38_2_
    ;
    *(ulong *)&(__return_storage_ptr__->ptr).field_1.value.decl.value.source._reader.nestingLimit =
         CONCAT44(local_e0.value.source._reader._44_4_,local_e0.value.source._reader.nestingLimit);
    (__return_storage_ptr__->ptr).field_1.value.decl.value.source._reader.data =
         local_e0.value.source._reader.data;
    (__return_storage_ptr__->ptr).field_1.value.decl.value.source._reader.pointers =
         (WirePointer *)
         CONCAT26(local_e0.value.source._reader.pointers._6_2_,
                  local_e0.value.source._reader.pointers._0_6_);
    (__return_storage_ptr__->ptr).field_1.value.decl.value.source._reader.segment =
         local_e0.value.source._reader.segment;
    (__return_storage_ptr__->ptr).field_1.value.decl.value.source._reader.capTable =
         local_e0.value.source._reader.capTable;
    local_338._0_8_ = (Mutex *)0x0;
    kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::~ExternalMutexGuarded
              ((ExternalMutexGuarded<capnp::compiler::BrandedDecl> *)local_338);
    kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::~ExternalMutexGuarded(&local_240);
  }
  kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::~ExternalMutexGuarded(&local_e0);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Compiler::CompiledType> Compiler::ModuleScope::evalType(
    Expression::Reader expression, ErrorReporter& errorReporter) {
  kj::ExternalMutexGuarded<BrandedDecl> newDecl;
  bool found = false;

  {
    auto lock = compiler.impl.lockExclusive();
    auto brandScope = kj::refcounted<BrandScope>(errorReporter, node.getId(), 0, node);
    KJ_IF_SOME(result, brandScope->compileDeclExpression(
        expression, node, ImplicitParams::none())) {
      newDecl.set(lock, kj::mv(result));
      found = true;
    };
  }

  if (found) {
    return CompiledType(compiler, kj::mv(newDecl));
  } else {
    return kj::none;
  }
}